

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O1

void __thiscall KktCheck::chPrimalFeas(KktCheck *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  
  this->i = 0;
  if (0 < this->numRow) {
    iVar9 = 0;
    bVar5 = true;
    do {
      lVar7 = (long)iVar9;
      piVar1 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar9 = piVar1[lVar7];
      lVar8 = (long)iVar9;
      this->k = iVar9;
      dVar11 = 0.0;
      if (iVar9 < piVar1[lVar7 + 1]) {
        piVar2 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar9 = iVar9 + 1;
          dVar11 = dVar11 + pdVar4[piVar2[lVar8]] * pdVar3[lVar8];
          lVar8 = lVar8 + 1;
          this->k = iVar9;
        } while (lVar8 < piVar1[lVar7 + 1]);
      }
      dVar10 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7];
      if ((dVar11 < dVar10) &&
         (dVar10 = ABS(dVar11 - dVar10), this->tol <= dVar10 && dVar10 != this->tol)) {
        if (this->print == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Row ",4);
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,
                              (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," infeasible: Row value=",0x17);
          poVar6 = std::ostream::_M_insert<double>(dVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  L=",4);
          poVar6 = std::ostream::_M_insert<double>
                             ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  U=",4);
          poVar6 = std::ostream::_M_insert<double>
                             ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        bVar5 = false;
      }
      dVar10 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[this->i];
      if ((dVar10 < dVar11) &&
         (dVar10 = ABS(dVar11 - dVar10), this->tol <= dVar10 && dVar10 != this->tol)) {
        if (this->print == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Row ",4);
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,
                              (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," infeasible: Row value=",0x17);
          poVar6 = std::ostream::_M_insert<double>(dVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  L=",4);
          poVar6 = std::ostream::_M_insert<double>
                             ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  U=",4);
          poVar6 = std::ostream::_M_insert<double>
                             ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        bVar5 = false;
      }
      iVar9 = this->i + 1;
      this->i = iVar9;
    } while (iVar9 < this->numRow);
    if (!bVar5) {
      if (this->print == 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"KKT check error: Primal infeasible.\n",0x24);
      }
      this->istrueGlb = true;
      return;
    }
  }
  if (this->print != 1) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Primal feasible.\n",0x11);
  return;
}

Assistant:

void KktCheck::chPrimalFeas() {
	bool istrue = true;
	double rowV;
	//Ax = b
	for (i=0; i<numRow;i++) {
		rowV = 0;
		for (k=ARstart[i]; k<ARstart[i+1]; k++) 
			rowV = rowV + colValue[ARindex[k]]*ARvalue[k];

		if ( ((rowV-rowLower[i]) < 0) && (abs(rowV-rowLower[i]) > tol)) {
			if (print == 1) 
				cout<<"Row "<<rIndexRev[i]<<" infeasible: Row value="<<rowV<<"  L="<<rowLower[i]<<"  U="<<rowUpper[i]<<endl;
				//cout<<"Row "<<i<<" infeasible: Row value="<<rowV<<"  L="<<rowLower[i]<<"  U="<<rowUpper[i]<<endl;
			istrue = false;
		}

		if ( ((rowV-rowUpper[i]) > 0) && (abs(rowV-rowUpper[i]) > tol)) {
					if (print == 1)
						cout<<"Row "<<rIndexRev[i]<<" infeasible: Row value="<<rowV<<"  L="<<rowLower[i]<<"  U="<<rowUpper[i]<<endl;
						//cout<<"Row "<<i<<" infeasible: Row value="<<rowV<<"  L="<<rowLower[i]<<"  U="<<rowUpper[i]<<endl;
					istrue = false;
				}
	}
	
	if (istrue) {
		if (print == 1) 
			cout<<"Primal feasible.\n";
	}
	else {
		if (print == 1) 
			cout<<"KKT check error: Primal infeasible.\n";
		istrueGlb = true;
	}

}